

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O3

uint aom_highbd_10_mse16x16_sse2
               (uint8_t *src8,int src_stride,uint8_t *ref8,int ref_stride,uint *sse)

{
  uint uVar1;
  undefined8 in_RAX;
  int sum0;
  uint sse0;
  undefined1 auStack_18 [4];
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  aom_highbd_calc16x16var_sse2
            ((long)src8 * 2,src_stride,(long)ref8 * 2,ref_stride,&local_14,auStack_18);
  uVar1 = (uint)((ulong)local_14 + 8 >> 4);
  *sse = uVar1;
  return uVar1;
}

Assistant:

unsigned int aom_highbd_10_mse16x16_sse2(const uint8_t *src8, int src_stride,
                                         const uint8_t *ref8, int ref_stride,
                                         unsigned int *sse) {
  int sum;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  highbd_10_variance_sse2(src, src_stride, ref, ref_stride, 16, 16, sse, &sum,
                          aom_highbd_calc16x16var_sse2, 16);
  return *sse;
}